

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_gpu_texture.h
# Opt level: O0

void __thiscall basisu::gpu_image::clear(gpu_image *this)

{
  undefined4 *in_RDI;
  
  *in_RDI = 0xffffffff;
  in_RDI[1] = 0;
  in_RDI[2] = 0;
  in_RDI[5] = 0;
  in_RDI[6] = 0;
  in_RDI[3] = 0;
  in_RDI[4] = 0;
  in_RDI[7] = 0;
  vector<unsigned_long>::clear((vector<unsigned_long> *)this);
  return;
}

Assistant:

void clear()
		{
			m_fmt = texture_format::cInvalidTextureFormat;
			m_width = 0;
			m_height = 0;
			m_block_width = 0;
			m_block_height = 0;
			m_blocks_x = 0;
			m_blocks_y = 0;
			m_qwords_per_block = 0;
			m_blocks.clear();
		}